

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

void google::protobuf::internal::WireFormatLite::WriteSInt64
               (int field_number,int64_t value,CodedOutputStream *output)

{
  io::CodedOutputStream::WriteVarint32(output,field_number * 8);
  WriteSInt64NoTag(value,output);
  return;
}

Assistant:

void WireFormatLite::WriteSInt64(int field_number, int64_t value,
                                 io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteSInt64NoTag(value, output);
}